

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::learn(recall_tree *b,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  node *pnVar5;
  uint32_t cn;
  node_pred *pnVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  predict(b,base,ec);
  if ((b->all->training == true) && ((ec->l).multi.label != 0xffffffff)) {
    uVar8 = 0;
    do {
      while( true ) {
        uVar7 = uVar8;
        bVar3 = (b->nodes)._begin[uVar7].internal;
        cn = (uint32_t)uVar7;
        if ((bool)bVar3 != true) goto LAB_001b205a;
        fVar9 = train_node(b,base,ec,cn);
        if (b->randomized_routing == true) {
          fVar10 = merand48(&b->all->random_state);
          fVar9 = (fVar9 + fVar9 + 1.0) * 0.5;
          if (1.0 <= fVar9) {
            fVar9 = 1.0;
          }
          if (fVar9 <= 0.0) {
            fVar9 = 0.0;
          }
          fVar9 = *(float *)(&DAT_00238820 + (ulong)(fVar9 < fVar10) * 4);
        }
        pnVar5 = (b->nodes)._begin;
        uVar2 = (&pnVar5[uVar7].left)[0.0 <= fVar9];
        uVar8 = (ulong)uVar2;
        if (0.0 < b->bern_hyper) break;
        insert_example_at_node(b,cn,ec);
      }
      fVar9 = pnVar5[uVar7].recall_lbest;
      fVar10 = pnVar5[uVar8].recall_lbest;
      insert_example_at_node(b,cn,ec);
    } while (fVar9 < fVar10);
    insert_example_at_node(b,uVar2,ec);
    bVar3 = (b->nodes)._begin[uVar7].internal;
LAB_001b205a:
    if ((bVar3 & 1) == 0) {
      insert_example_at_node(b,cn,ec);
    }
    bVar4 = is_candidate(b,cn,ec);
    if (bVar4) {
      uVar2 = (ec->l).multi.label;
      fVar9 = (ec->l).simple.weight;
      fVar10 = (ec->pred).scalar;
      add_node_id_feature(b,cn,ec);
      (ec->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
      (ec->l).simple.initial = 0.0;
      LEARNER::learner<char,_example>::learn(base,ec,(b->max_routers + (ulong)uVar2) - 1);
      (ec->l).cs.costs._begin = (wclass *)0x3f800000bf800000;
      (ec->l).simple.initial = 0.0;
      pnVar5 = (b->nodes)._begin;
      for (pnVar6 = pnVar5[uVar7].preds._begin;
          (pnVar6 != pnVar5[uVar7].preds._end &&
          (pnVar6 < pnVar5[uVar7].preds._begin + b->max_candidates)); pnVar6 = pnVar6 + 1) {
        if (pnVar6->label != uVar2) {
          LEARNER::learner<char,_example>::learn
                    (base,ec,((ulong)pnVar6->label + b->max_routers) - 1);
          pnVar5 = (b->nodes)._begin;
        }
      }
      features::clear((ec->super_example_predict).feature_space + 0x88);
      ppuVar1 = &(ec->super_example_predict).indices._end;
      *ppuVar1 = *ppuVar1 + -1;
      (ec->l).multi.label = uVar2;
      (ec->l).simple.weight = fVar9;
      (ec->pred).scalar = fVar10;
    }
  }
  return;
}

Assistant:

void learn(recall_tree& b, single_learner& base, example& ec)
{
  predict(b, base, ec);

  if (b.all->training && ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    uint32_t cn = 0;

    while (b.nodes[cn].internal)
    {
      float which = train_node(b, base, ec, cn);

      if (b.randomized_routing)
        which = (merand48(b.all->random_state) > to_prob(which) ? -1.f : 1.f);

      uint32_t newcn = descend(b.nodes[cn], which);
      bool cond = stop_recurse_check(b, cn, newcn);
      insert_example_at_node(b, cn, ec);

      if (cond)
      {
        insert_example_at_node(b, newcn, ec);
        break;
      }

      cn = newcn;
    }

    if (!b.nodes[cn].internal)
      insert_example_at_node(b, cn, ec);

    if (is_candidate(b, cn, ec))
    {
      MULTICLASS::label_t mc = ec.l.multi;
      uint32_t save_pred = ec.pred.multiclass;

      add_node_id_feature(b, cn, ec);

      ec.l.simple = {1.f, 1.f, 0.f};
      base.learn(ec, b.max_routers + mc.label - 1);
      ec.l.simple = {-1.f, 1.f, 0.f};

      for (node_pred* ls = b.nodes[cn].preds.begin();
           ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
      {
        if (ls->label != mc.label)
          base.learn(ec, b.max_routers + ls->label - 1);
      }

      remove_node_id_feature(b, cn, ec);

      ec.l.multi = mc;
      ec.pred.multiclass = save_pred;
    }
  }
}